

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2ParallelRead.cpp
# Opt level: O3

expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *
idx2::ParallelReadChunkExponents
          (expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *__return_storage_ptr__,
          idx2_file *Idx2,decode_data *D,u64 Brick,i8 Level,i8 Subband)

{
  undefined8 uVar1;
  int iVar2;
  u64 *puVar3;
  long lVar4;
  byte *pbVar5;
  i64 iVar6;
  allocator *paVar7;
  byte *pbVar8;
  u64 uVar9;
  undefined4 uVar10;
  decode_data *pdVar11;
  __off_t _Var12;
  __off_t _Var13;
  ulong uVar14;
  FILE *pFVar15;
  long lVar16;
  char cVar17;
  byte bVar18;
  unsigned_long *Key;
  uint uVar19;
  int iVar20;
  ulong *puVar21;
  undefined8 uVar22;
  ulong uVar23;
  undefined7 in_register_00000081;
  chunk_exp_cache *Val;
  undefined7 in_register_00000089;
  expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *peVar24;
  ulong uVar25;
  uint uVar26;
  size_t sVar27;
  uint uVar28;
  long *in_FS_OFFSET;
  error<idx2::idx2_err_code> eVar29;
  int S;
  int ChunkAddrsSz;
  int NChunks;
  int ExponentSize;
  u64 ChunkAddress;
  file_id FileId;
  iterator FileCacheIt;
  u64 ChunkAddr;
  unique_lock<std::mutex> Lock;
  timer IOTimer;
  timer IOTimer_1;
  file_cache FileCache;
  chunk_exp_cache ChunkExpCache;
  int local_270;
  uint local_26c;
  expected<idx2::chunk_exp_cache,_idx2::idx2_err_code> *local_268;
  FILE *local_260;
  int local_258;
  uint local_254;
  decode_data *local_250;
  ulong *local_248;
  idx2_file *local_240;
  undefined4 local_234;
  uint local_230;
  int local_22c;
  undefined1 local_228 [40];
  allocator *paStack_200;
  undefined8 *local_1f8;
  anon_union_8_2_2df48d06_for_stref_0 local_1f0 [2];
  undefined1 local_1e0 [16];
  bucket_status *local_1d0;
  long local_1c8;
  long local_1c0;
  buffer local_1b8;
  u64 local_198;
  undefined1 local_190 [16];
  undefined1 local_180;
  timespec local_178;
  iterator local_168;
  undefined1 local_148 [96];
  hash_table<unsigned_long,_idx2::chunk_exp_cache> local_e8;
  array<int> local_b8;
  undefined8 local_88;
  timespec local_70;
  undefined8 uStack_60;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined1 local_38;
  
  local_190._8_8_ = &D->FileCacheMutex;
  local_180 = 0;
  local_268 = __return_storage_ptr__;
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)(local_190 + 8));
  local_180 = 1;
  local_230 = (uint)CONCAT71(in_register_00000081,Level);
  Key = (unsigned_long *)(CONCAT71(in_register_00000081,Level) & 0xffffffff);
  local_234 = (undefined4)CONCAT71(in_register_00000089,Subband);
  local_240 = Idx2;
  local_198 = Brick;
  ConstructFilePath((file_id *)local_1f0,Idx2,Brick,(i8)Key,Subband,0);
  Lookup<unsigned_long,idx2::file_cache>
            ((iterator *)(local_1e0 + 8),(idx2 *)&D->FileCacheTable,
             (hash_table<unsigned_long,_idx2::file_cache> *)local_1e0,Key);
  clock_gettime(1,&local_178);
  if ((*(char *)(*(long *)(local_1c8 + 0x10) + local_1c0) == '\x02') &&
     (local_1d0[200] == Tombstone)) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xe1;
    cVar17 = '\0';
    peVar24 = local_268;
  }
  else {
    pFVar15 = fopen(local_1f0[0].Ptr,"rb");
    peVar24 = local_268;
    local_260 = pFVar15;
    if (pFVar15 == (FILE *)0x0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0xe4;
      lVar16 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '%') {
          cVar17 = '%';
          goto LAB_001976ea;
        }
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x3b8);
      cVar17 = '\'';
LAB_001976ea:
      lVar16 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == cVar17) {
          lVar4 = *in_FS_OFFSET;
          iVar20 = snprintf((char *)(lVar4 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                            (ulong)*(uint *)(&action_s::NameMap + lVar16),
                            *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar16),
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                            ,0xe4);
          snprintf((char *)(lVar4 + -0xf80) + iVar20,0x400 - (long)iVar20,"File: %s",
                   local_1f0[0].Ptr);
          cVar17 = '%';
          pFVar15 = local_260;
          goto LAB_00197976;
        }
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x3b8);
      goto LAB_00197c80;
    }
    fseeko(pFVar15,0,2);
    _Var12 = ftello(pFVar15);
    local_22c = 0;
    _Var13 = ftello(pFVar15);
    fseeko(pFVar15,_Var13 + -4,0);
    fread(&local_22c,4,1,pFVar15);
    fseeko(pFVar15,_Var13 + -4,0);
    local_254 = 0;
    _Var13 = ftello(pFVar15);
    fseeko(pFVar15,_Var13 + -4,0);
    fread(&local_254,4,1,pFVar15);
    fseeko(pFVar15,_Var13 + -4,0);
    _Var13 = ftello(pFVar15);
    fseeko(pFVar15,_Var13 + -4,0);
    fread(&local_258,4,1,pFVar15);
    fseeko(pFVar15,_Var13 + -4,0);
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunkExponents();
    }
    local_228._0_8_ = (unsigned_long *)0x0;
    local_228._8_8_ = (chunk_exp_cache *)0x0;
    local_228._16_8_ = &Mallocator()::Instance;
    lVar16 = (long)local_258;
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunkExponents();
    }
    AllocBuf((buffer *)local_228,lVar16,(allocator *)&Mallocator()::Instance);
    sVar27 = (size_t)local_258;
    if ((long)local_228._8_8_ < (long)sVar27) {
LAB_00197e6c:
      __assert_fail("Sz <= Size(*Buf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/InputOutput.h"
                    ,0x9d,"void idx2::ReadBackwardBuffer(FILE *, buffer *, i64)");
    }
    _Var13 = ftello(pFVar15);
    fseeko(pFVar15,_Var13 - sVar27,0);
    fread((void *)local_228._0_8_,sVar27,1,pFVar15);
    fseeko(pFVar15,_Var13 - sVar27,0);
    LOCK();
    (D->BytesData_).super___atomic_base<unsigned_long>._M_i =
         (D->BytesData_).super___atomic_base<unsigned_long>._M_i + sVar27;
    UNLOCK();
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunkExponents();
    }
    local_1b8.Data = (byte *)0x0;
    local_1b8.Bytes = 0;
    local_1b8.Alloc = (allocator *)&Mallocator()::Instance;
    lVar16 = (long)(int)local_254;
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunkExponents();
    }
    AllocBuf(&local_1b8,lVar16 << 3,(allocator *)&Mallocator()::Instance);
    DecompressBufZstd((buffer *)local_228,&local_1b8);
    local_270 = 0;
    _Var13 = ftello(pFVar15);
    fseeko(pFVar15,_Var13 + -4,0);
    fread(&local_270,4,1,pFVar15);
    fseeko(pFVar15,_Var13 + -4,0);
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunkExponents();
    }
    local_228._32_8_ = (ulong *)0x0;
    paStack_200 = (allocator *)0x0;
    local_1f8 = &Mallocator()::Instance;
    lVar16 = (long)local_270;
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunkExponents();
    }
    AllocBuf((buffer *)(local_228 + 0x20),lVar16,(allocator *)&Mallocator()::Instance);
    sVar27 = (size_t)local_270;
    if ((long)paStack_200 < (long)sVar27) goto LAB_00197e6c;
    _Var13 = ftello(pFVar15);
    fseeko(pFVar15,_Var13 - sVar27,0);
    fread((void *)local_228._32_8_,sVar27,1,pFVar15);
    fseeko(pFVar15,_Var13 - sVar27,0);
    LOCK();
    (D->BytesExps_).super___atomic_base<unsigned_long>._M_i =
         (D->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar27 + 4;
    UNLOCK();
    clock_gettime(1,(timespec *)local_148);
    LOCK();
    (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
         (D->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
         (long)((double)(local_148._0_8_ - local_178.tv_sec) * 1000000000.0 +
               (double)(local_148._8_8_ - local_178.tv_nsec));
    UNLOCK();
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunkExponents();
    }
    local_248 = (ulong *)local_228._32_8_;
    uVar14 = *(ulong *)local_228._32_8_;
    file_cache::file_cache((file_cache *)local_148);
    if (Mallocator()::Instance == '\0') {
      ParallelReadChunkExponents();
    }
    Init<unsigned_long,idx2::chunk_exp_cache>
              ((hash_table<unsigned_long,_idx2::chunk_exp_cache> *)(local_148 + 0x60),10,
               (allocator *)&Mallocator()::Instance);
    iVar20 = local_270;
    local_88 = _Var12 - local_22c;
    GrowCapacity<int>((array<int> *)(local_148 + 0x90),(long)local_270);
    local_250 = D;
    if (iVar20 < 1) {
      uVar25 = 0;
    }
    else {
      uVar25 = 0;
      uVar28 = 0;
      uVar19 = 0;
      puVar21 = local_248;
      do {
        bVar18 = 0;
        lVar16 = 0;
        do {
          if (0x39 < (int)uVar28) {
            uVar14 = *(ulong *)((long)puVar21 + (ulong)(uVar28 >> 3));
            puVar21 = (ulong *)((long)puVar21 + (ulong)(uVar28 >> 3));
            uVar28 = uVar28 & 7;
          }
          uVar23 = uVar14 >> ((byte)uVar28 & 0x3f);
          uVar26 = uVar28 + 7;
          if (0x38 < (int)uVar28) {
            uVar14 = *(ulong *)((long)puVar21 + (ulong)(uVar26 >> 3));
            puVar21 = (ulong *)((long)puVar21 + (ulong)(uVar26 >> 3));
            uVar26 = 0;
          }
          Val = (chunk_exp_cache *)(uVar14 >> ((byte)uVar26 & 0x3f));
          lVar16 = lVar16 + ((uVar23 & bitstream::Masks.Arr[7]) << (bVar18 & 0x3f));
          uVar28 = uVar26 + 1;
          bVar18 = bVar18 + 7;
        } while (((ulong)Val & bitstream::Masks.Arr[1]) != 0);
        local_26c = uVar19;
        if (local_b8.Capacity <= local_b8.Size) {
          GrowCapacity<int>((array<int> *)(local_148 + 0x90),0);
        }
        uVar19 = local_26c + (int)lVar16;
        uVar1 = local_b8.Size + Tombstone;
        *(uint *)(local_b8.Buffer.Data + local_b8.Size * 4) = uVar19;
        local_190._0_8_ = ((allocator *)((long)local_1b8.Data + uVar25 * 8))->_vptr_allocator;
        local_b8.Size = uVar1;
        if (Mallocator()::Instance == '\0') {
          ParallelReadChunkExponents();
        }
        local_70.tv_nsec = 0;
        uStack_60 = 0;
        local_58 = &Mallocator()::Instance;
        local_50 = 0;
        uStack_48 = 0;
        local_40 = 0;
        local_38 = 0;
        local_70.tv_sec._0_4_ = (undefined4)uVar25;
        Insert<unsigned_long,idx2::chunk_exp_cache>
                  (&local_168,(idx2 *)(local_148 + 0x60),
                   (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)local_190,
                   (unsigned_long *)&local_70,Val);
        uVar25 = uVar25 + 1;
        iVar20 = uVar26 + 0xf;
        if (-1 < (int)(uVar26 + 8)) {
          iVar20 = uVar26 + 8;
        }
        pFVar15 = local_260;
      } while ((long)puVar21 + ((long)(iVar20 >> 3) - (long)local_248) < (long)local_270);
    }
    D = local_250;
    if (local_254 != (uint)uVar25) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x115;
      lVar16 = 0x10;
      local_26c = local_254;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '\x04') {
          cVar17 = '\x04';
          goto LAB_00197789;
        }
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x3b8);
      cVar17 = '\'';
LAB_00197789:
      lVar16 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == cVar17) {
          local_248 = *(ulong **)((long)(action_s::NameMap.Arr + 2) + lVar16);
          lVar4 = *in_FS_OFFSET;
          iVar20 = snprintf((char *)(lVar4 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                            (ulong)*(uint *)(&action_s::NameMap + lVar16),local_248,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                            ,0x115);
          snprintf((char *)(lVar4 + -0xf80) + iVar20,0x400 - (long)iVar20,
                   "number of chunks is either %d or %d\n",(ulong)local_26c,uVar25 & 0xffffffff);
          goto LAB_0019794a;
        }
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x3b8);
      goto LAB_00197c80;
    }
    if ((long)(int)(uint)uVar25 % (local_240->Subbands).Size != 0) {
      *(char **)(*in_FS_OFFSET + -0xb80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x11c;
      lVar16 = 0x10;
      do {
        if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '\x04') {
          cVar17 = '\x04';
          goto LAB_001978a9;
        }
        lVar16 = lVar16 + 0x18;
      } while (lVar16 != 0x3b8);
      cVar17 = '\'';
LAB_001978a9:
      lVar16 = 0x10;
LAB_001978ae:
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) != cVar17)
      goto code_r0x001978b3;
      lVar4 = *in_FS_OFFSET;
      iVar20 = snprintf((char *)(lVar4 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                        (ulong)*(uint *)(&action_s::NameMap + lVar16),
                        *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar16),
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                        ,0x11c);
      snprintf((char *)(lVar4 + -0xf80) + iVar20,0x400 - (long)iVar20,
               "number of chunks = %d is not divisible by number of subbands which is %d\n",
               uVar25 & 0xffffffff,(ulong)(uint)(local_240->Subbands).Size);
      D = local_250;
LAB_0019794a:
      cVar17 = '\x04';
      pFVar15 = local_260;
      goto LAB_0019794f;
    }
    if (*(char *)(*(long *)(local_1c8 + 0x10) + local_1c0) == '\x02') {
      *(undefined8 *)(local_1d0 + 0xc0) = local_88;
      *(byte **)(local_1d0 + 0x90) = local_b8.Buffer.Data;
      *(i64 *)(local_1d0 + 0x98) = local_b8.Buffer.Bytes;
      *(allocator **)(local_1d0 + 0xa0) = local_b8.Buffer.Alloc;
      *(i64 *)(local_1d0 + 0xa8) = local_b8.Size;
      *(allocator **)(local_1d0 + 0xa0) = local_b8.Buffer.Alloc;
      *(i64 *)(local_1d0 + 0xa8) = local_b8.Size;
      *(i64 *)(local_1d0 + 0xb0) = local_b8.Capacity;
      *(allocator **)(local_1d0 + 0xb8) = local_b8.Alloc;
      *(unsigned_long **)(local_1d0 + 0x60) = local_e8.Keys;
      *(chunk_exp_cache **)(local_1d0 + 0x68) = local_e8.Vals;
      *(bucket_status **)(local_1d0 + 0x70) = local_e8.Stats;
      *(i64 *)(local_1d0 + 0x78) = local_e8.Size;
      *(bucket_status **)(local_1d0 + 0x70) = local_e8.Stats;
      *(i64 *)(local_1d0 + 0x78) = local_e8.Size;
      *(i64 *)(local_1d0 + 0x80) = local_e8.LogCapacity;
      *(allocator **)(local_1d0 + 0x88) = local_e8.Alloc;
    }
    else {
      Insert<unsigned_long,idx2::file_cache>
                ((iterator *)(local_1e0 + 8),(unsigned_long *)local_1e0,(file_cache *)local_148);
    }
    local_1d0[200] = Tombstone;
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x12e;
    cVar17 = '\0';
LAB_0019794f:
    peVar24 = local_268;
    DeallocBuf((buffer *)(local_228 + 0x20));
    DeallocBuf(&local_1b8);
    DeallocBuf((buffer *)local_228);
LAB_00197976:
    if (pFVar15 != (FILE *)0x0) {
      fclose(pFVar15);
    }
  }
  if ((cVar17 != '\0') || (*(char *)(*(long *)(local_1c8 + 0x10) + local_1c0) != '\x02')) {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x154;
    lVar16 = 0x10;
    do {
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == '%') {
        cVar17 = '%';
        goto LAB_00197c69;
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x3b8);
    cVar17 = '\'';
LAB_00197c69:
    lVar16 = 0x10;
    do {
      if (*(char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar16) == cVar17) {
        lVar4 = *in_FS_OFFSET;
        iVar20 = snprintf((char *)(lVar4 + -0xf80),0x400,"%.*s (file %s, line %d): ",
                          (ulong)*(uint *)(&action_s::NameMap + lVar16),
                          *(undefined8 *)((long)(action_s::NameMap.Arr + 2) + lVar16),
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
                          ,0x154);
        snprintf((char *)(lVar4 + -0xf80) + iVar20,0x400 - (long)iVar20,"File: %s\n",
                 local_1f0[0].Ptr);
        peVar24->_vptr_expected = (_func_int **)&PTR__expected_001d0c08;
        (peVar24->field_1).Err.Msg = "File: %s\n";
        (peVar24->field_1).Err.StrGened = true;
        *(undefined2 *)((long)&peVar24->field_1 + 8) = 0x25;
        goto LAB_00197d33;
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar16 != 0x3b8);
LAB_00197c80:
    __assert_fail("It != End(EnumS.NameMap)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.h"
                  ,0x38,"stref idx2::ToString(idx2_err_code)");
  }
  if ('\x0f' < (char)local_230) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
  }
  uVar14 = (ulong)(local_240->BricksPerChunk).Arr[(char)local_230];
  lVar16 = 0x3f;
  if (uVar14 != 0) {
    for (; uVar14 >> lVar16 == 0; lVar16 = lVar16 + -1) {
    }
  }
  bVar18 = -(uVar14 == 0) | (byte)lVar16;
  local_228._0_8_ =
       (long)((int)(char)local_234 << 0xc) + ((ulong)(local_230 & 0xff) << 0x3c) +
       (local_198 >> ((1L << (bVar18 & 0x3f) != uVar14) + bVar18 & 0x3f)) * 0x40000;
  Lookup<unsigned_long,idx2::chunk_exp_cache>
            ((iterator *)local_148,(idx2 *)(local_1d0 + 0x60),
             (hash_table<unsigned_long,_idx2::chunk_exp_cache> *)local_228,
             (unsigned_long *)local_228._0_8_);
  uVar1 = local_148._8_8_;
  if ((*(bucket_status **)(local_148._16_8_ + 0x10))[local_148._24_8_] == Occupied) {
    if ((((bitstream *)(local_148._8_8_ + 8))->Stream).Bytes == 0) {
      clock_gettime(1,(timespec *)&local_168);
      pFVar15 = fopen(local_1f0[0].Ptr,"rb");
      if (pFVar15 == (FILE *)0x0) {
        local_148._0_8_ = local_1f0;
        eVar29 = ParallelReadChunkExponents::anon_class_8_1_1e916d15::operator()
                           ((anon_class_8_1_1e916d15 *)local_148);
        peVar24->_vptr_expected = (_func_int **)&PTR__expected_001d0c08;
        (peVar24->field_1).Err.Msg = eVar29.Msg;
        *(short *)((long)&peVar24->field_1 + 8) = eVar29._8_2_;
        (peVar24->field_1).Err.StrGened = eVar29.StrGened;
LAB_00197d33:
        peVar24->Ok = false;
        goto LAB_00197d39;
      }
      lVar16 = (long)*(i32 *)uVar1;
      uVar22 = *(undefined8 *)(local_1d0 + 0xc0);
      iVar20 = *(int *)(*(undefined8 *)(local_1d0 + 0x90) + lVar16 * 4);
      if (0 < lVar16) {
        iVar2 = *(int *)((*(undefined8 *)(local_1d0 + 0x90) - 4) + lVar16 * 4);
        uVar22 = uVar22 + (long)iVar2;
        iVar20 = iVar20 - iVar2;
      }
      local_250 = D;
      fseeko(pFVar15,uVar22,0);
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunkExponents();
      }
      local_148._0_8_ = (anon_union_8_2_2df48d06_for_stref_0 *)0x0;
      local_148._8_8_ = (chunk_exp_cache *)0x0;
      local_148._16_8_ = &Mallocator()::Instance;
      sVar27 = (size_t)iVar20;
      if (Mallocator()::Instance == '\0') {
        ParallelReadChunkExponents();
      }
      AllocBuf((buffer *)local_148,sVar27,(allocator *)&Mallocator()::Instance);
      fread((void *)local_148._0_8_,sVar27,1,pFVar15);
      DecompressBufZstd((buffer *)local_148,(bitstream *)(uVar1 + 8));
      pdVar11 = local_250;
      LOCK();
      (local_250->BytesDecoded_).super___atomic_base<unsigned_long>._M_i =
           (local_250->BytesDecoded_).super___atomic_base<unsigned_long>._M_i + sVar27;
      UNLOCK();
      LOCK();
      (local_250->BytesExps_).super___atomic_base<unsigned_long>._M_i =
           (local_250->BytesExps_).super___atomic_base<unsigned_long>._M_i + sVar27;
      UNLOCK();
      clock_gettime(1,&local_70);
      LOCK();
      (pdVar11->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i =
           (pdVar11->DecodeIOTime_).super___atomic_base<unsigned_long>._M_i +
           (long)((double)(CONCAT44(local_70.tv_sec._4_4_,(undefined4)local_70.tv_sec) -
                          (long)local_168.Key) * 1000000000.0 +
                 (double)(local_70.tv_nsec - (long)local_168.Val));
      UNLOCK();
      puVar3 = (u64 *)(((bitstream *)(uVar1 + 8))->Stream).Data;
      ((bitstream *)(uVar1 + 8))->BitBuf = 0;
      ((bitstream *)(uVar1 + 8))->BitPtr = (byte *)puVar3;
      ((bitstream *)(uVar1 + 8))->BitBuf = *puVar3;
      ((bitstream *)(uVar1 + 8))->BitPos = 0;
      DeallocBuf((buffer *)local_148);
      fclose(pFVar15);
    }
    peVar24->_vptr_expected = (_func_int **)&PTR__expected_001d0c08;
    pbVar5 = (((bitstream *)(uVar1 + 8))->Stream).Data;
    iVar6 = (((bitstream *)(uVar1 + 8))->Stream).Bytes;
    paVar7 = (((bitstream *)(uVar1 + 8))->Stream).Alloc;
    pbVar8 = ((bitstream *)(uVar1 + 8))->BitPtr;
    uVar9 = ((bitstream *)(uVar1 + 8))->BitBuf;
    iVar20 = ((bitstream *)(uVar1 + 8))->BitPos;
    uVar10 = *(undefined4 *)&((bitstream *)(uVar1 + 8))->field_0x2c;
    uVar22 = *(undefined8 *)(uVar1 + 0x38);
    (peVar24->field_1).Err.Msg = *(cstr *)uVar1;
    (peVar24->field_1).Val.ChunkExpStream.Stream.Data = pbVar5;
    (peVar24->field_1).Val.ChunkExpStream.Stream.Bytes = iVar6;
    (peVar24->field_1).Val.ChunkExpStream.Stream.Alloc = paVar7;
    (peVar24->field_1).Val.ChunkExpStream.BitPtr = pbVar8;
    (peVar24->field_1).Val.ChunkExpStream.BitBuf = uVar9;
    *(int *)((long)&peVar24->field_1 + 0x30) = iVar20;
    *(undefined4 *)((long)&peVar24->field_1 + 0x34) = uVar10;
    *(undefined8 *)((long)&peVar24->field_1 + 0x38) = uVar22;
    peVar24->Ok = true;
  }
  else {
    *(char **)(*in_FS_OFFSET + -0xb80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2ParallelRead.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0x980) = 0x15d;
    peVar24->_vptr_expected = (_func_int **)&PTR__expected_001d0c08;
    (peVar24->field_1).Err.Msg = "";
    (peVar24->field_1).Err.StrGened = false;
    *(undefined2 *)((long)&peVar24->field_1 + 8) = 0x23;
    peVar24->Ok = false;
  }
LAB_00197d39:
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)(local_190 + 8));
  return peVar24;
code_r0x001978b3:
  lVar16 = lVar16 + 0x18;
  if (lVar16 == 0x3b8) goto LAB_00197c80;
  goto LAB_001978ae;
}

Assistant:

expected<chunk_exp_cache, idx2_err_code>
ParallelReadChunkExponents(const idx2_file& Idx2, decode_data* D, u64 Brick, i8 Level, i8 Subband)
{
#if VISUS_IDX2
  if (Idx2.external_read)
  {
    std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
    u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
    auto ChunkExpCacheIt = Lookup(D->FileCache.ChunkExpCaches, ChunkAddress);
    if (ChunkExpCacheIt)
      return *ChunkExpCacheIt.Val;

    // here we release he lock and read the chunk
    // read the block
    buffer buff;
    bool Result = Idx2.external_read(Idx2, buff, ChunkAddress).get();
    idx2_ReturnErrorIf(!Result, idx2_err_code::ChunkNotFound);

    // decompress the block
    chunk_exp_cache ChunkExpCache;
    bitstream& ChunkExpStream = ChunkExpCache.ChunkExpStream;
    DecompressBufZstd(buff, &ChunkExpStream);
    InitRead(&ChunkExpCache.ChunkExpStream, ChunkExpStream.Stream);
    Insert(&ChunkExpCacheIt, ChunkAddress, ChunkExpCache);
    return *ChunkExpCacheIt.Val;
  }
#endif
  std::unique_lock<std::mutex> Lock(D->FileCacheMutex);
  file_id FileId = ConstructFilePath(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  auto FileCacheIt = Lookup(D->FileCacheTable, FileId.Id);
  auto Result = ParallelReadFileExponents(Idx2, D, Level, &FileCacheIt, FileId);
  if (!Result || !FileCacheIt)
    return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);

  /* find the appropriate chunk */
  u64 ChunkAddress = GetChunkAddress(Idx2, Brick, Level, Subband, ExponentBitPlane_);
  file_cache* FileCache = FileCacheIt.Val;
  decltype(FileCache->ChunkExpCaches)::iterator ChunkCacheIt;
  // TODO: lock and be careful about invalidated pointer
  ChunkCacheIt = Lookup(FileCache->ChunkExpCaches, ChunkAddress);
  if (!ChunkCacheIt)
    return idx2_Error(idx2_err_code::ChunkNotFound);

  chunk_exp_cache* ChunkExpCache = ChunkCacheIt.Val;
  if (Size(ChunkExpCache->ChunkExpStream.Stream) == 0) // chunk has not been loaded
  {
    timer IOTimer;
    StartTimer(&IOTimer);
    idx2_RAII(FILE*, Fp = fopen(FileId.Name.ConstPtr, "rb"), , if (Fp) fclose(Fp));
    if (!Fp)
      return idx2_Error(idx2_err_code::FileNotFound, "File: %s\n", FileId.Name.ConstPtr);
    i32 ChunkPos = ChunkExpCache->ChunkPos;
    i64 ChunkExpOffset = FileCache->ExponentBeginOffset;
    i32 ChunkExpSize = FileCache->ChunkExpOffsets[ChunkPos];
    if (ChunkPos > 0)
    {
      i32 PrevChunkOffset = FileCache->ChunkExpOffsets[ChunkPos - 1];
      ChunkExpOffset += PrevChunkOffset;
      ChunkExpSize -= PrevChunkOffset;
    }
    idx2_FSeek(Fp, ChunkExpOffset, SEEK_SET);
    bitstream& ChunkExpStream = ChunkExpCache->ChunkExpStream;
    idx2_ScopeBuffer(CompressedChunkExpsBuf, ChunkExpSize);
    ReadBuffer(Fp, &CompressedChunkExpsBuf, ChunkExpSize);
    DecompressBufZstd(CompressedChunkExpsBuf, &ChunkExpStream);
    D->BytesDecoded_ += ChunkExpSize;
    D->BytesExps_ += ChunkExpSize;
    D->DecodeIOTime_ += ElapsedTime(&IOTimer);
    InitRead(&ChunkExpStream, ChunkExpStream.Stream);
  }

  return *ChunkCacheIt.Val;
}